

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  bool bVar1;
  undefined1 local_f8 [24];
  Slice local_e0;
  Status local_d0;
  undefined1 local_c8 [8];
  Status s;
  Version *base;
  VersionEdit edit;
  DBImpl *this_local;
  
  edit.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  port::Mutex::AssertHeld(&this->mutex_);
  if (this->imm_ == (MemTable *)0x0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x222,"void leveldb::DBImpl::CompactMemTable()");
  }
  VersionEdit::VersionEdit((VersionEdit *)&base);
  s.state_ = (char *)VersionSet::current(this->versions_);
  Version::Ref((Version *)s.state_);
  WriteLevel0Table((DBImpl *)local_c8,(MemTable *)this,(VersionEdit *)this->imm_,(Version *)&base);
  Version::Unref((Version *)s.state_);
  bVar1 = Status::ok((Status *)local_c8);
  if ((bVar1) &&
     (bVar1 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire), bVar1)) {
    Slice::Slice(&local_e0,"Deleting DB during memtable compaction");
    Slice::Slice((Slice *)(local_f8 + 8));
    Status::IOError(&local_d0,&local_e0,(Slice *)(local_f8 + 8));
    Status::operator=((Status *)local_c8,&local_d0);
    Status::~Status(&local_d0);
  }
  bVar1 = Status::ok((Status *)local_c8);
  if (bVar1) {
    VersionEdit::SetPrevLogNumber((VersionEdit *)&base,0);
    VersionEdit::SetLogNumber((VersionEdit *)&base,this->logfile_number_);
    VersionSet::LogAndApply((VersionSet *)local_f8,(VersionEdit *)this->versions_,(Mutex *)&base);
    Status::operator=((Status *)local_c8,(Status *)local_f8);
    Status::~Status((Status *)local_f8);
  }
  bVar1 = Status::ok((Status *)local_c8);
  if (bVar1) {
    MemTable::Unref(this->imm_);
    this->imm_ = (MemTable *)0x0;
    std::atomic<bool>::store(&this->has_imm_,false,memory_order_release);
    RemoveObsoleteFiles(this);
  }
  else {
    RecordBackgroundError(this,(Status *)local_c8);
  }
  Status::~Status((Status *)local_c8);
  VersionEdit::~VersionEdit((VersionEdit *)&base);
  return;
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    RemoveObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}